

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O3

int __thiscall
pybind11::detail::process_attribute<pybind11::arg_v,_void>::init
          (process_attribute<pybind11::arg_v,_void> *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  char *extraout_RAX;
  char *pcVar2;
  bool local_22;
  bool local_21;
  handle local_20;
  void *local_18;
  
  if ((((byte)ctx[0x59] & 0x10) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_18 = (void *)0x0;
    local_20.m_ptr = (PyObject *)0x0;
    local_21 = true;
    local_22 = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])"self",&local_18,&local_20,&local_21,&local_22);
  }
  plVar1 = *(long **)(this + 0x10);
  if (plVar1 != (long *)0x0) {
    *plVar1 = *plVar1 + 1;
    local_18 = (void *)(CONCAT71(local_18._1_7_,~(byte)this[8]) & 0xffffffffffffff01);
    local_20.m_ptr =
         (PyObject *)(CONCAT71(local_20.m_ptr._1_7_,(byte)this[8] >> 1) & 0xffffffffffffff01);
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const*const&,char_const*const&,pybind11::handle_const&,bool,bool_const&>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char **)this,(char **)(this + 0x18),(handle *)(this + 0x10),
               (bool *)&local_18,(bool *)&local_20);
    pcVar2 = extraout_RAX;
    if (((byte)ctx[0x59] & 0x80) != 0) {
      pcVar2 = *(char **)this;
      if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
        pybind11_fail("arg(): cannot specify an unnamed argument after an kw_only() annotation");
      }
      *(short *)(ctx + 0x5e) = *(short *)(ctx + 0x5e) + 1;
    }
    return (int)pcVar2;
  }
  pybind11_fail(
               "arg(): could not convert default argument into a Python object (type not registered yet?). Compile in debug mode for more information."
               );
}

Assistant:

static void init(const arg_v &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr /*descr*/, handle() /*parent*/, true /*convert*/, false /*none not allowed*/);

        if (!a.value) {
#if !defined(NDEBUG)
            std::string descr("'");
            if (a.name) descr += std::string(a.name) + ": ";
            descr += a.type + "'";
            if (r->is_method) {
                if (r->name)
                    descr += " in method '" + (std::string) str(r->scope) + "." + (std::string) r->name + "'";
                else
                    descr += " in method of '" + (std::string) str(r->scope) + "'";
            } else if (r->name) {
                descr += " in function '" + (std::string) r->name + "'";
            }
            pybind11_fail("arg(): could not convert default argument "
                          + descr + " into a Python object (type not registered yet?)");
#else
            pybind11_fail("arg(): could not convert default argument "
                          "into a Python object (type not registered yet?). "
                          "Compile in debug mode for more information.");
#endif
        }
        r->args.emplace_back(a.name, a.descr, a.value.inc_ref(), !a.flag_noconvert, a.flag_none);

        if (r->has_kw_only_args) process_kw_only_arg(a, r);
    }